

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::commit_new_buffer(flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
                    *this,char **buffer,size_t *buffer_size)

{
  pointer_type pcVar1;
  pointer_type pcVar2;
  pointer_type pcVar3;
  pointer_type pcVar4;
  size_t sVar5;
  buffer_type *pbVar6;
  size_type old_size;
  char *old_begin;
  size_t *buffer_size_local;
  char **buffer_local;
  flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  pbVar6 = buff(this);
  pcVar1 = pbVar6->begin;
  pbVar6 = buff(this);
  pcVar2 = pbVar6->end;
  pbVar6 = buff(this);
  if (pcVar2 < pbVar6->begin) {
    std::terminate();
  }
  pbVar6 = buff(this);
  pcVar2 = pbVar6->end;
  pbVar6 = buff(this);
  pcVar3 = pbVar6->begin;
  if ((*buffer == (char *)0x0) && (*buffer_size != 0)) {
    std::terminate();
  }
  if ((*buffer != (char *)0x0) && (*buffer_size == 0)) {
    std::terminate();
  }
  pcVar4 = *buffer;
  pbVar6 = buff(this);
  pbVar6->begin = pcVar4;
  pbVar6 = buff(this);
  pcVar4 = pbVar6->begin;
  sVar5 = *buffer_size;
  pbVar6 = buff(this);
  pbVar6->end = pcVar4 + sVar5;
  *buffer = pcVar1;
  *buffer_size = (long)pcVar2 - (long)pcVar3;
  return;
}

Assistant:

void commit_new_buffer(char *&buffer, size_t &buffer_size) noexcept {
        char *old_begin = buff().begin;
        FFL_CODDING_ERROR_IF(buff().end < buff().begin);
        size_type old_size = buff().end - buff().begin;
        FFL_CODDING_ERROR_IF(buffer == nullptr && buffer_size != 0);
        FFL_CODDING_ERROR_IF(buffer != nullptr && buffer_size == 0);
        buff().begin = buffer;
        buff().end = buff().begin + buffer_size;
        buffer = old_begin;
        buffer_size = old_size;
    }